

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O3

void __thiscall UnifiedRegex::TrigramAlphabet::InitTrigramMap(TrigramAlphabet *this)

{
  short sVar1;
  short sVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar13;
  undefined1 in_XMM0 [16];
  undefined1 auVar6 [16];
  long lVar14;
  undefined1 auVar7 [16];
  uint uVar12;
  uint uVar15;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar16;
  long lVar17;
  uint uVar26;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  long lVar27;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint uVar25;
  uint uVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar29;
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  long lVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  int iVar43;
  uint uVar52;
  int iVar53;
  uint uVar54;
  int iVar55;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar57;
  uint uVar58;
  long lVar59;
  long lVar60;
  uint uVar66;
  undefined1 in_XMM5 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  long lVar67;
  uint uVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long lVar68;
  undefined1 auVar64 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar71 [16];
  long lVar72;
  undefined1 in_XMM8 [16];
  undefined1 auVar73 [16];
  long lVar75;
  undefined1 auVar74 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar78;
  undefined1 in_XMM11 [16];
  undefined1 auVar79 [16];
  long lVar81;
  undefined1 auVar80 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  long lVar84;
  undefined1 in_XMM13 [16];
  undefined1 auVar85 [16];
  long lVar87;
  undefined1 auVar86 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar88 [16];
  long local_138;
  long lStack_130;
  long local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  long local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  
  this->input = (char16 *)0x0;
  auVar76 = pmovsxbd(in_XMM10,0xf0e0d0c);
  auVar71 = pmovsxbd(in_XMM7,0xb0a0908);
  auVar88 = pmovsxbd(in_XMM15,0x7060504);
  auVar38 = pmovsxbd(in_XMM3,0x3020100);
  auVar6 = pmovsxbq(in_XMM0,0xf0e);
  auVar18 = pmovsxbq(in_XMM1,0xd0c);
  auVar30 = pmovsxbq(in_XMM2,0xb0a);
  auVar73 = pmovsxbq(in_XMM8,0x908);
  auVar61 = pmovsxbq(in_XMM5,0x706);
  auVar79 = pmovsxbq(in_XMM11,0x504);
  auVar70 = pmovsxbq(in_XMM6,0x302);
  auVar85 = pmovsxbq(in_XMM13,0x100);
  lVar3 = 0;
  do {
    lVar17 = SUB168(auVar18 ^ _DAT_00fa8550,0);
    auVar44._0_8_ = -(ulong)(lVar17 < -0x7fffffffffffff23);
    lVar27 = SUB168(auVar18 ^ _DAT_00fa8550,8);
    auVar44._8_8_ = -(ulong)(lVar27 < -0x7fffffffffffff23);
    lVar5 = SUB168(auVar6 ^ _DAT_00fa8550,0);
    auVar19._0_8_ = -(ulong)(lVar5 < -0x7fffffffffffff23);
    lVar14 = SUB168(auVar6 ^ _DAT_00fa8550,8);
    auVar19._8_8_ = -(ulong)(lVar14 < -0x7fffffffffffff23);
    auVar7 = packssdw(auVar44,auVar19);
    lVar72 = SUB168(auVar73 ^ _DAT_00fa8550,0);
    auVar45._0_8_ = -(ulong)(lVar72 < -0x7fffffffffffff23);
    lVar75 = SUB168(auVar73 ^ _DAT_00fa8550,8);
    auVar45._8_8_ = -(ulong)(lVar75 < -0x7fffffffffffff23);
    lVar29 = SUB168(auVar30 ^ _DAT_00fa8550,0);
    auVar20._0_8_ = -(ulong)(lVar29 < -0x7fffffffffffff23);
    lVar37 = SUB168(auVar30 ^ _DAT_00fa8550,8);
    auVar20._8_8_ = -(ulong)(lVar37 < -0x7fffffffffffff23);
    auVar46 = packssdw(auVar45,auVar20);
    lVar78 = SUB168(auVar79 ^ _DAT_00fa8550,0);
    auVar31._0_8_ = -(ulong)(lVar78 < -0x7fffffffffffff23);
    lVar81 = SUB168(auVar79 ^ _DAT_00fa8550,8);
    auVar31._8_8_ = -(ulong)(lVar81 < -0x7fffffffffffff23);
    lVar59 = SUB168(auVar61 ^ _DAT_00fa8550,0);
    auVar21._0_8_ = -(ulong)(lVar59 < -0x7fffffffffffff23);
    lVar67 = SUB168(auVar61 ^ _DAT_00fa8550,8);
    auVar21._8_8_ = -(ulong)(lVar67 < -0x7fffffffffffff23);
    auVar32 = packssdw(auVar31,auVar21);
    uVar58 = auVar76._0_4_;
    auVar62._0_4_ = uVar58 >> 3;
    uVar65 = auVar76._4_4_;
    auVar62._4_4_ = uVar65 >> 3;
    uVar66 = auVar76._8_4_;
    uVar69 = auVar76._12_4_;
    auVar62._8_4_ = uVar66 >> 3;
    auVar62._12_4_ = uVar69 >> 3;
    auVar62 = auVar62 | auVar76;
    auVar63._0_4_ = (auVar62._0_4_ << 0x1d) >> 0x1f;
    auVar63._4_4_ = (auVar62._4_4_ << 0x1d) >> 0x1f;
    auVar63._8_4_ = (auVar62._8_4_ << 0x1d) >> 0x1f;
    auVar63._12_4_ = (auVar62._12_4_ << 0x1d) >> 0x1f;
    uVar16 = auVar71._0_4_;
    auVar22._0_4_ = uVar16 >> 3;
    uVar25 = auVar71._4_4_;
    auVar22._4_4_ = uVar25 >> 3;
    uVar26 = auVar71._8_4_;
    uVar28 = auVar71._12_4_;
    auVar22._8_4_ = uVar26 >> 3;
    auVar22._12_4_ = uVar28 >> 3;
    auVar22 = auVar22 | auVar71;
    auVar34._0_4_ = (auVar22._0_4_ << 0x1d) >> 0x1f;
    auVar34._4_4_ = (auVar22._4_4_ << 0x1d) >> 0x1f;
    auVar34._8_4_ = (auVar22._8_4_ << 0x1d) >> 0x1f;
    auVar34._12_4_ = (auVar22._12_4_ << 0x1d) >> 0x1f;
    auVar22 = packssdw(auVar34 & auVar46,auVar63 & auVar7);
    uVar42 = auVar88._0_4_;
    auVar47._0_4_ = uVar42 >> 3;
    uVar52 = auVar88._4_4_;
    auVar47._4_4_ = uVar52 >> 3;
    uVar54 = auVar88._8_4_;
    uVar56 = auVar88._12_4_;
    auVar47._8_4_ = uVar54 >> 3;
    auVar47._12_4_ = uVar56 >> 3;
    auVar47 = auVar47 | auVar88;
    auVar48._0_4_ = auVar47._0_4_ << 0x1d;
    auVar48._4_4_ = auVar47._4_4_ << 0x1d;
    auVar48._8_4_ = auVar47._8_4_ << 0x1d;
    auVar48._12_4_ = auVar47._12_4_ << 0x1d;
    lVar84 = SUB168(auVar85 ^ _DAT_00fa8550,0);
    auVar33._0_8_ = -(ulong)(lVar84 < -0x7fffffffffffff23);
    lVar87 = SUB168(auVar85 ^ _DAT_00fa8550,8);
    auVar33._8_8_ = -(ulong)(lVar87 < -0x7fffffffffffff23);
    lVar60 = SUB168(auVar70 ^ _DAT_00fa8550,0);
    auVar7._0_8_ = -(ulong)(lVar60 < -0x7fffffffffffff23);
    lVar68 = SUB168(auVar70 ^ _DAT_00fa8550,8);
    auVar7._8_8_ = -(ulong)(lVar68 < -0x7fffffffffffff23);
    auVar47 = pshuflw(auVar88,auVar33,0xe8);
    auVar34 = packssdw(auVar33,auVar7);
    uVar4 = auVar38._0_4_;
    auVar46._0_4_ = uVar4 >> 3;
    uVar12 = auVar38._4_4_;
    auVar46._4_4_ = uVar12 >> 3;
    uVar13 = auVar38._8_4_;
    uVar15 = auVar38._12_4_;
    auVar46._8_4_ = uVar13 >> 3;
    auVar46._12_4_ = uVar15 >> 3;
    auVar46 = auVar46 | auVar38;
    auVar36._0_4_ = auVar46._0_4_ << 0x1d;
    auVar36._4_4_ = auVar46._4_4_ << 0x1d;
    auVar36._8_4_ = auVar46._8_4_ << 0x1d;
    auVar36._12_4_ = auVar46._12_4_ << 0x1d;
    auVar46 = packssdw(auVar36 & auVar34,auVar48 & auVar32);
    auVar46 = packsswb(auVar46,auVar22);
    auVar22 = pmovsxbd(auVar70,0x7070707);
    auVar35._0_4_ = uVar16 >> 2;
    auVar35._4_4_ = uVar25 >> 2;
    auVar35._8_4_ = uVar26 >> 2;
    auVar35._12_4_ = uVar28 >> 2;
    auVar34 = pmovsxbd(in_XMM12,0x30303030);
    auVar36 = auVar35 & auVar34 | auVar71 & auVar22;
    auVar32._0_4_ = uVar58 >> 2;
    auVar32._4_4_ = uVar65 >> 2;
    auVar32._8_4_ = uVar66 >> 2;
    auVar32._12_4_ = uVar69 >> 2;
    auVar71 = auVar32 & auVar34 | auVar76 & auVar22;
    auVar77._0_4_ = uVar4 >> 2;
    auVar77._4_4_ = uVar12 >> 2;
    auVar77._8_4_ = uVar13 >> 2;
    auVar77._12_4_ = uVar15 >> 2;
    auVar76 = auVar77 & auVar34 | auVar38 & auVar22;
    auVar39._0_4_ = uVar42 >> 2;
    auVar39._4_4_ = uVar52 >> 2;
    auVar39._8_4_ = uVar54 >> 2;
    auVar39._12_4_ = uVar56 >> 2;
    auVar38 = auVar39 & auVar34 | auVar88 & auVar22;
    auVar82._0_4_ = uVar42 >> 1;
    auVar82._4_4_ = uVar52 >> 1;
    auVar82._8_4_ = uVar54 >> 1;
    auVar82._12_4_ = uVar56 >> 1;
    auVar88 = pmovsxbd(auVar88,0x1c1c1c1c);
    auVar82 = auVar82 & auVar88;
    auVar83._0_4_ = auVar82._0_4_ + auVar38._0_4_;
    auVar83._4_4_ = auVar82._4_4_ + auVar38._4_4_;
    auVar83._8_4_ = auVar82._8_4_ + auVar38._8_4_;
    auVar83._12_4_ = auVar82._12_4_ + auVar38._12_4_;
    auVar49._0_4_ = uVar4 >> 1;
    auVar49._4_4_ = uVar12 >> 1;
    auVar49._8_4_ = uVar13 >> 1;
    auVar49._12_4_ = uVar15 >> 1;
    auVar49 = auVar49 & auVar88;
    auVar50._0_4_ = auVar49._0_4_ + auVar76._0_4_;
    auVar50._4_4_ = auVar49._4_4_ + auVar76._4_4_;
    auVar50._8_4_ = auVar49._8_4_ + auVar76._8_4_;
    auVar50._12_4_ = auVar49._12_4_ + auVar76._12_4_;
    auVar76 = packusdw(auVar50,auVar83);
    auVar40._0_4_ = uVar58 >> 1;
    auVar40._4_4_ = uVar65 >> 1;
    auVar40._8_4_ = uVar66 >> 1;
    auVar40._12_4_ = uVar69 >> 1;
    auVar40 = auVar40 & auVar88;
    auVar41._0_4_ = auVar40._0_4_ + auVar71._0_4_;
    auVar41._4_4_ = auVar40._4_4_ + auVar71._4_4_;
    auVar41._8_4_ = auVar40._8_4_ + auVar71._8_4_;
    auVar41._12_4_ = auVar40._12_4_ + auVar71._12_4_;
    auVar23._0_4_ = uVar16 >> 1;
    auVar23._4_4_ = uVar25 >> 1;
    auVar23._8_4_ = uVar26 >> 1;
    auVar23._12_4_ = uVar28 >> 1;
    auVar23 = auVar23 & auVar88;
    auVar24._0_4_ = auVar23._0_4_ + auVar36._0_4_;
    auVar24._4_4_ = auVar23._4_4_ + auVar36._4_4_;
    auVar24._8_4_ = auVar23._8_4_ + auVar36._8_4_;
    auVar24._12_4_ = auVar23._12_4_ + auVar36._12_4_;
    auVar38 = packusdw(auVar24,auVar41);
    sVar1 = auVar76._0_2_;
    sVar2 = auVar76._2_2_;
    auVar51[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[2] - (0xff < sVar2);
    auVar51[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[0] - (0xff < sVar1);
    sVar1 = auVar76._4_2_;
    auVar51[2] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[4] - (0xff < sVar1);
    sVar1 = auVar76._6_2_;
    auVar51[3] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[6] - (0xff < sVar1);
    sVar1 = auVar76._8_2_;
    auVar51[4] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[8] - (0xff < sVar1);
    sVar1 = auVar76._10_2_;
    auVar51[5] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[10] - (0xff < sVar1);
    sVar1 = auVar76._12_2_;
    auVar51[6] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[0xc] - (0xff < sVar1);
    sVar1 = auVar76._14_2_;
    auVar51[7] = (0 < sVar1) * (sVar1 < 0x100) * auVar76[0xe] - (0xff < sVar1);
    sVar1 = auVar38._0_2_;
    auVar51[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[0] - (0xff < sVar1);
    sVar1 = auVar38._2_2_;
    auVar51[9] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[2] - (0xff < sVar1);
    sVar1 = auVar38._4_2_;
    auVar51[10] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[4] - (0xff < sVar1);
    sVar1 = auVar38._6_2_;
    auVar51[0xb] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[6] - (0xff < sVar1);
    sVar1 = auVar38._8_2_;
    auVar51[0xc] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[8] - (0xff < sVar1);
    sVar1 = auVar38._10_2_;
    auVar51[0xd] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[10] - (0xff < sVar1);
    sVar1 = auVar38._12_2_;
    auVar51[0xe] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[0xc] - (0xff < sVar1);
    sVar1 = auVar38._14_2_;
    auVar51[0xf] = (0 < sVar1) * (sVar1 < 0x100) * auVar38[0xe] - (0xff < sVar1);
    auVar38 = pblendvb(auVar51,_DAT_011a1fd0,auVar46);
    auVar71 = packssdw(auVar47,auVar47);
    if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3] = auVar38[0];
    }
    auVar86._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar84);
    auVar86._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar87);
    auVar71 = packssdw(auVar86,auVar86);
    in_XMM12._8_4_ = 0xffffffff;
    in_XMM12._0_8_ = 0xffffffffffffffff;
    in_XMM12._12_4_ = 0xffffffff;
    auVar71 = packssdw(auVar71 ^ in_XMM12,auVar71 ^ in_XMM12);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 1] = auVar38[1];
    }
    auVar64._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar60);
    auVar64._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar68);
    auVar71 = packssdw(auVar46,auVar64);
    auVar71 = packssdw(auVar71 ^ in_XMM12,auVar71 ^ in_XMM12);
    auVar71 = packsswb(auVar71,auVar71);
    local_128 = auVar18._0_8_;
    lStack_120 = auVar18._8_8_;
    local_118 = auVar30._0_8_;
    lStack_110 = auVar30._8_8_;
    local_d8 = auVar70._0_8_;
    lStack_d0 = auVar70._8_8_;
    local_c8 = auVar85._0_8_;
    lStack_c0 = auVar85._8_8_;
    if ((auVar71 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 2] = auVar38[2];
    }
    auVar18 = pshufhw(auVar71,auVar7,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    local_f8 = auVar61._0_8_;
    lStack_f0 = auVar61._8_8_;
    if ((auVar18 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 3] = auVar38[3];
    }
    auVar18 = pshuflw(auVar18,auVar31,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 4] = auVar38[4];
    }
    auVar80._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar78);
    auVar80._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar81);
    auVar30 = packssdw(auVar80,auVar80);
    auVar18 = packssdw(auVar18,auVar30 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 5] = auVar38[5];
    }
    auVar8._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar59);
    auVar8._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar67);
    auVar18 = packssdw(auVar8,auVar8);
    auVar18 = packssdw(auVar18 ^ in_XMM12,auVar18 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar18);
    local_e8 = auVar79._0_8_;
    lStack_e0 = auVar79._8_8_;
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 6] = auVar38[6];
    }
    auVar18 = pshufhw(auVar18,auVar21,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 7] = auVar38[7];
    }
    auVar18 = pshuflw(auVar18,auVar45,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 8] = auVar38[8];
    }
    auVar74._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar72);
    auVar74._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar75);
    auVar30 = packssdw(auVar74,auVar74);
    auVar30 = packssdw(auVar30 ^ in_XMM12,auVar30 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar30);
    if ((auVar18 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 9] = auVar38[9];
    }
    auVar9._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar29);
    auVar9._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar37);
    auVar18 = packssdw(auVar9,auVar9);
    auVar18 = packssdw(auVar18 ^ in_XMM12,auVar18 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar18);
    local_108 = auVar73._0_8_;
    lStack_100 = auVar73._8_8_;
    if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 10] = auVar38[10];
    }
    auVar18 = pshufhw(auVar18,auVar20,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 0xb] = auVar38[0xb];
    }
    auVar18 = pshuflw(auVar18,auVar44,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 0xc] = auVar38[0xc];
    }
    auVar10._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar17);
    auVar10._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar27);
    auVar18 = packssdw(auVar10,auVar10);
    auVar18 = packssdw(auVar18 ^ in_XMM12,auVar18 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 0xd] = auVar38[0xd];
    }
    auVar11._0_8_ = -(ulong)(-0x7fffffffffffff24 < lVar5);
    auVar11._8_8_ = -(ulong)(-0x7fffffffffffff24 < lVar14);
    auVar18 = packssdw(auVar11,auVar11);
    auVar18 = packssdw(auVar18 ^ in_XMM12,auVar18 ^ in_XMM12);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 0xe] = auVar38[0xe];
    }
    auVar18 = pshufhw(auVar18,auVar19,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
      this->trigramMap[lVar3 + 0xf] = auVar38[0xf];
    }
    lVar3 = lVar3 + 0x10;
    auVar38 = pmovsxbq(auVar38,0x1010);
    lVar5 = auVar38._0_8_;
    auVar85._0_8_ = local_c8 + lVar5;
    lVar14 = auVar38._8_8_;
    auVar85._8_8_ = lStack_c0 + lVar14;
    auVar70._0_8_ = local_d8 + lVar5;
    auVar70._8_8_ = lStack_d0 + lVar14;
    auVar79._0_8_ = local_e8 + lVar5;
    auVar79._8_8_ = lStack_e0 + lVar14;
    auVar61._0_8_ = local_f8 + lVar5;
    auVar61._8_8_ = lStack_f0 + lVar14;
    auVar73._0_8_ = local_108 + lVar5;
    auVar73._8_8_ = lStack_100 + lVar14;
    auVar30._0_8_ = local_118 + lVar5;
    auVar30._8_8_ = lStack_110 + lVar14;
    auVar18._0_8_ = local_128 + lVar5;
    auVar18._8_8_ = lStack_120 + lVar14;
    local_138 = auVar6._0_8_;
    lStack_130 = auVar6._8_8_;
    auVar6._0_8_ = local_138 + lVar5;
    auVar6._8_8_ = lStack_130 + lVar14;
    auVar71 = pmovsxbd(auVar38,0x10101010);
    iVar43 = auVar71._0_4_;
    auVar38._0_4_ = uVar4 + iVar43;
    iVar53 = auVar71._4_4_;
    auVar38._4_4_ = uVar12 + iVar53;
    iVar55 = auVar71._8_4_;
    auVar38._8_4_ = uVar13 + iVar55;
    iVar57 = auVar71._12_4_;
    auVar38._12_4_ = uVar15 + iVar57;
    auVar88._0_4_ = uVar42 + iVar43;
    auVar88._4_4_ = uVar52 + iVar53;
    auVar88._8_4_ = uVar54 + iVar55;
    auVar88._12_4_ = uVar56 + iVar57;
    auVar71._0_4_ = uVar16 + iVar43;
    auVar71._4_4_ = uVar25 + iVar53;
    auVar71._8_4_ = uVar26 + iVar55;
    auVar71._12_4_ = uVar28 + iVar57;
    auVar76._0_4_ = uVar58 + iVar43;
    auVar76._4_4_ = uVar65 + iVar53;
    auVar76._8_4_ = uVar66 + iVar55;
    auVar76._12_4_ = uVar69 + iVar57;
  } while (lVar3 != 0xe0);
  lVar3 = 0;
  do {
    *(undefined4 *)((long)this->trigramStarts[0].patterns + lVar3 + -8) = 0;
    lVar3 = lVar3 + 200;
  } while (lVar3 != 0x3200);
  return;
}

Assistant:

void TrigramAlphabet::InitTrigramMap() {
        input=NULL;
        // set up mapping from 9 bits to trigram
        for (int i=0;i<TrigramMapSize;i++) {
            int t1=i>>6;
            int t2=(i>>3)&0x7;
            int t3=i&0x7;
            if ((t1>=AlphaCount)||(t2>=AlphaCount)||(t3>=AlphaCount)) {
                trigramMap[i]=TrigramNotInPattern;
            }
            else {
                // number of trigram
                trigramMap[i]=(char)((t1<<4)+(t2<<2)+t3);
            }
        }

        for (int j=0;j<TrigramCount;j++) {
            trigramStarts[j].count=0;
        }
    }